

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O3

void applyInstrument(MidiFile *midifile,int timbre)

{
  uint channel;
  int iVar1;
  MidiEventList *this;
  uint uVar2;
  MidiEvent pcMessage;
  MidiEvent local_60;
  
  iVar1 = smf::MidiFile::getTrackCount(midifile);
  smf::MidiEvent::MidiEvent(&local_60);
  local_60.tick = 0;
  for (uVar2 = 1; uVar2 != 0xd; uVar2 = uVar2 + 1) {
    channel = uVar2 - 1;
    if (8 < uVar2 - 1) {
      channel = uVar2;
    }
    smf::MidiMessage::makePatchChange(&local_60.super_MidiMessage,channel,timbre);
    this = smf::MidiFile::operator[](midifile,(uint)(1 < iVar1));
    smf::MidiEventList::append(this,&local_60);
  }
  smf::MidiEvent::~MidiEvent(&local_60);
  return;
}

Assistant:

void applyInstrument(MidiFile& midifile, int timbre) {
	int track = 0;
	if (midifile.getTrackCount() > 1) {
		track = 1;
	}
	MidiEvent pcMessage;
	pcMessage.tick = 0;  // add messages at start of track (after sorting)
	for (int i=0; i<12; i++) {
		int chan = (i < 0x09) ? i : i+1;
		pcMessage.makePatchChange(chan, timbre);
		midifile[track].append(pcMessage);
	}
}